

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

bool __thiscall QFileSystemModel::event(QFileSystemModel *this,QEvent *event)

{
  long lVar1;
  byte bVar2;
  Type TVar3;
  pointer this_00;
  QEvent *in_RSI;
  QEvent *in_RDI;
  long in_FS_OFFSET;
  QFileSystemModelPrivate *d;
  undefined1 local_21;
  QString *in_stack_ffffffffffffffe0;
  QAbstractFileIconProvider *in_stack_ffffffffffffffe8;
  QFileSystemNode *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFileSystemModel *)0xaa995f);
  TVar3 = QEvent::type(in_RSI);
  if (TVar3 == LanguageChange) {
    this_00 = std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::
              operator->((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)
                         0xaa9994);
    QFileInfoGatherer::iconProvider((QFileInfoGatherer *)this_00);
    QString::QString((QString *)0xaa99ab);
    QFileSystemModelPrivate::QFileSystemNode::retranslateStrings
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    QString::~QString((QString *)0xaa99c9);
    local_21 = true;
  }
  else {
    bVar2 = QObject::event(in_RDI);
    local_21 = (bool)(bVar2 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::event(QEvent *event)
{
#if QT_CONFIG(filesystemwatcher)
    Q_D(QFileSystemModel);
    if (event->type() == QEvent::LanguageChange) {
        d->root.retranslateStrings(d->fileInfoGatherer->iconProvider(), QString());
        return true;
    }
#endif
    return QAbstractItemModel::event(event);
}